

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O1

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
::getIntercept_Cpu(GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                   *this,Array4<double> *inter,Array4<const_unsigned_int> *type,Geometry *geom,
                  Box *bounding_box,int idim)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int local_cc;
  Dim3 local_c8;
  Dim3 local_b8;
  GpuArray<double,_3U> local_a8;
  GpuArray<double,_3U> local_88;
  Box local_70;
  anon_class_64_8_f246ecda local_50;
  
  local_50.idim = &local_cc;
  local_88.arr[0] = (geom->super_CoordSys).dx[0];
  local_88.arr[1] = (geom->super_CoordSys).dx[1];
  local_50.dx = &local_88;
  local_88.arr[2] = (geom->super_CoordSys).dx[2];
  local_a8.arr[0] = (geom->prob_domain).xlo[0];
  local_a8.arr[1] = (geom->prob_domain).xlo[1];
  local_50.problo = &local_a8;
  local_a8.arr[2] = (geom->prob_domain).xlo[2];
  local_b8.z = (bounding_box->smallend).vect[2];
  local_b8.x = (bounding_box->smallend).vect[0];
  local_b8.y = (bounding_box->smallend).vect[1];
  local_50.blo = &local_b8;
  local_c8.z = (bounding_box->bigend).vect[2];
  local_c8.x = (bounding_box->bigend).vect[0];
  local_c8.y = (bounding_box->bigend).vect[1];
  local_50.bhi = &local_c8;
  local_70.smallend.vect[2] = (inter->begin).z;
  local_70.smallend.vect[0] = (inter->begin).x;
  local_70.smallend.vect[1] = (inter->begin).y;
  local_70.bigend.vect[2] = (inter->end).z + -1;
  uVar1 = (inter->end).x;
  uVar2 = (inter->end).y;
  local_70.bigend.vect[1] = uVar2 + -1;
  local_70.bigend.vect[0] = uVar1 + -1;
  local_70.btype.itype = 0;
  local_cc = idim;
  local_50.type = type;
  local_50.inter = inter;
  local_50.this = this;
  LoopOnCpu<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>::getIntercept_Cpu(amrex::Array4<double>const&,amrex::Array4<unsigned_int_const>const&,amrex::Geometry_const&,amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            (&local_70,&local_50);
  return;
}

Assistant:

void getIntercept_Cpu (Array4<Real> const& inter,
                           Array4<Type_t const> const& type,
                           Geometry const& geom,
                           Box const& bounding_box,
                           const int idim) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        const auto blo = amrex::lbound(bounding_box);
        const auto bhi = amrex::ubound(bounding_box);
        const Box bx{inter};
        amrex::LoopOnCpu(bx, [&] (int i, int j, int k) noexcept
        {
            if (type(i,j,k) == Type::irregular) {
                IntVect ivlo(AMREX_D_DECL(i,j,k));
                IntVect ivhi(AMREX_D_DECL(i,j,k));
                ivhi[idim] += 1;
                inter(i,j,k) = BrentRootFinder
                    ({AMREX_D_DECL(problo[0]+amrex::Clamp(ivlo[0],blo.x,bhi.x)*dx[0],
                                   problo[1]+amrex::Clamp(ivlo[1],blo.y,bhi.y)*dx[1],
                                   problo[2]+amrex::Clamp(ivlo[2],blo.z,bhi.z)*dx[2])},
                     {AMREX_D_DECL(problo[0]+amrex::Clamp(ivhi[0],blo.x,bhi.x)*dx[0],
                                   problo[1]+amrex::Clamp(ivhi[1],blo.y,bhi.y)*dx[1],
                                   problo[2]+amrex::Clamp(ivhi[2],blo.z,bhi.z)*dx[2])},
                     idim, m_f);
            } else {
                inter(i,j,k) = std::numeric_limits<Real>::quiet_NaN();
            }
        });
    }